

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_struct_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  int *piVar1;
  long lVar2;
  t_field *ptVar3;
  bool bVar4;
  string *psVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  pointer pptVar8;
  t_cpp_generator *this_00;
  _Alloc_hider _Var9;
  string name;
  string local_140;
  t_struct *local_120;
  string local_118;
  undefined4 local_f4;
  string local_f0;
  string local_d0;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_f4 = (undefined4)CONCAT71(in_register_00000009,pointers);
  local_120 = tstruct;
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_b0 = local_a0;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar6);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar2,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar2);
  if (this->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                             local_140._M_dataplus._M_p._0_1_),
                        local_140._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"template <class Protocol_>",0x1a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"uint32_t ",9);
    iVar6 = (*(local_120->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"::write(Protocol_* oprot) const {",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_) !=
        &local_140.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_));
    }
  }
  else {
    poVar7 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"uint32_t ",9);
    iVar6 = (*(local_120->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_01,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"::write(::apache::thrift::protocol::TProtocol* oprot) const {",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                           local_140._M_dataplus._M_p._0_1_),
                      local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"uint32_t xfer = 0;",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_) !=
      &local_140.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_));
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"xfer += oprot->writeStructBegin(\"",0x21);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\");",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar8 = (local_120->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar8 ==
        (local_120->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                               local_140._M_dataplus._M_p._0_1_),
                          local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"xfer += oprot->writeFieldStop();",0x20);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"xfer += oprot->writeStructEnd();",0x20);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return xfer;",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_) !=
          &local_140.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_))
        ;
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      return;
    }
    if ((*pptVar8)->req_ == T_OPTIONAL) {
LAB_00184a34:
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
      ;
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                                  local_140._M_dataplus._M_p._0_1_),
                          local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (this->__isset.",0x12);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar8)->name_)._M_dataplus._M_p,
                          ((*pptVar8)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_) !=
          &local_140.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_))
        ;
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      bVar4 = true;
    }
    else {
      iVar6 = (*((*pptVar8)->type_->super_t_doc)._vptr_t_doc[0xc])();
      if ((char)iVar6 != '\0') goto LAB_00184a34;
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      bVar4 = false;
    }
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                             local_140._M_dataplus._M_p._0_1_),
                        local_140._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"xfer += oprot->writeFieldBegin(",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,((*pptVar8)->name_)._M_dataplus._M_p,
                        ((*pptVar8)->name_)._M_string_length);
    this_00 = (t_cpp_generator *)0x38b673;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", ",3);
    type_to_enum_abi_cxx11_(&local_118,this_00,(*pptVar8)->type_);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(*pptVar8)->key_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_) !=
        &local_140.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_140._M_dataplus._M_p._1_7_,local_140._M_dataplus._M_p._0_1_));
    }
    if ((char)local_f4 == '\0') {
LAB_00184c31:
      ptVar3 = *pptVar8;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"this->","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      generate_serialize_field(this,out,ptVar3,&local_f0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      psVar5 = &local_f0;
      _Var9._M_p = local_f0._M_dataplus._M_p;
    }
    else {
      iVar6 = (*((*pptVar8)->type_->super_t_doc)._vptr_t_doc[0xc])();
      if ((char)iVar6 != '\0') goto LAB_00184c31;
      ptVar3 = *pptVar8;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"(*(this->","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"))","");
      generate_serialize_field(this,out,ptVar3,&local_d0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      psVar5 = &local_d0;
      _Var9._M_p = local_d0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &psVar5->field_2) {
      operator_delete(_Var9._M_p);
    }
    poVar7 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"xfer += oprot->writeFieldEnd();",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (bVar4) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar7 = t_generator::indent((t_generator *)this,out);
      local_140._M_dataplus._M_p._0_1_ = 0x7d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_140,1);
    }
    pptVar8 = pptVar8 + 1;
  } while( true );
}

Assistant:

void t_cpp_generator::generate_struct_writer(ostream& out, t_struct* tstruct, bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << indent() << "uint32_t xfer = 0;" << endl;

  indent(out) << "::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);" << endl;
  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool check_if_set = (*f_iter)->get_req() == t_field::T_OPTIONAL
                        || (*f_iter)->get_type()->is_xception();
    if (check_if_set) {
      out << endl << indent() << "if (this->__isset." << (*f_iter)->get_name() << ") {" << endl;
      indent_up();
    } else {
      out << endl;
    }

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers && !(*f_iter)->get_type()->is_xception()) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;
    if (check_if_set) {
      indent_down();
      indent(out) << '}';
    }
  }

  out << endl;

  // Write the struct map
  out << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent()
      << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}